

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O1

void Iota(Sarray *A,int index)

{
  ulong *puVar1;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  allocator_type local_f9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  unsigned_long local_e0 [24];
  
  memcpy(local_e0,&DAT_00104008,0xc0);
  __l._M_len = 0x18;
  __l._M_array = local_e0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_f8,__l,&local_f9);
  puVar1 = (((A->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar1 = *puVar1 ^ local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[index];
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Iota(Sarray &A,int index){
    vector<uint64_t> v = {
        0b0000000000000000000000000000000000000000000000000000000000000001,
        0b0000000000000000000000000000000000000000000000001000000010000010,
        0b1000000000000000000000000000000000000000000000001000000010001010,
        0b1000000000000000000000000000000010000000000000001000000000000000,
        0b0000000000000000000000000000000000000000000000001000000010001011,
        0b0000000000000000000000000000000010000000000000000000000000000001,
        0b1000000000000000000000000000000010000000000000001000000010000001,
        0b1000000000000000000000000000000000000000000000001000000000001001,
        0b0000000000000000000000000000000000000000000000000000000010001010,
        0b0000000000000000000000000000000000000000000000000000000010001000,
        0b0000000000000000000000000000000010000000000000001000000000001001,
        0b0000000000000000000000000000000010000000000000000000000000001010,
        0b0000000000000000000000000000000010000000000000001000000010001011,
        0b1000000000000000000000000000000000000000000000000000000010001011,
        0b1000000000000000000000000000000000000000000000001000000010001001,
        0b1000000000000000000000000000000000000000000000001000000000000011,
        0b1000000000000000000000000000000000000000000000001000000000000010,
        0b1000000000000000000000000000000000000000000000000000000010000000,
        0b0000000000000000000000000000000000000000000000001000000000001010,
        0b1000000000000000000000000000000010000000000000000000000000001010,
        0b1000000000000000000000000000000010000000000000001000000010000001,
        0b1000000000000000000000000000000000000000000000001000000010000000,
        0b0000000000000000000000000000000010000000000000000000000000000001,
        0b1000000000000000000000000000000010000000000000001000000000001000,
    };
    A[0][0] = A[0][0]^(v[index]);
}